

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
PA4Application::RenderObject::makeCheckerBoard(void)

{
  uint k;
  int iVar1;
  vector<unsigned_char,std::allocator<unsigned_char>> *in_RDI;
  int iVar2;
  bool bVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  uchar local_4c [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> row;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = 10;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      local_4c[0] = 0xff;
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = 0xff;
      __l._M_len = 4;
      __l._M_array = local_4c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (const_iterator)
                 row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,__l);
      local_4c[0] = '\0';
      local_4c[1] = 0xff;
      local_4c[2] = '\0';
      local_4c[3] = 0xff;
      __l_00._M_len = 4;
      __l_00._M_array = local_4c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (const_iterator)
                 row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,__l_00);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_RDI,(const_iterator)*(uchar **)(in_RDI + 8),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = 10;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      local_4c[0] = '\0';
      local_4c[1] = 0xff;
      local_4c[2] = '\0';
      local_4c[3] = 0xff;
      __l_01._M_len = 4;
      __l_01._M_array = local_4c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (const_iterator)
                 row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,__l_01);
      local_4c[0] = '\0';
      local_4c[1] = '\0';
      local_4c[2] = 0xff;
      local_4c[3] = 0xff;
      __l_02._M_len = 4;
      __l_02._M_array = local_4c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (const_iterator)
                 row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,__l_02);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_RDI,(const_iterator)*(uchar **)(in_RDI + 8),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&row.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<GLubyte> PA4Application::RenderObject::makeCheckerBoard()
{
  std::vector<GLubyte> checkerboard;
  for (uint k = 0; k < 10; ++k) {
    std::vector<GLubyte> row;
    for (uint j = 0; j < 10; ++j) {
      row.insert(row.begin(), {255, 0, 0, 255});
      row.insert(row.end(), {0, 255, 0, 255});
    }
    checkerboard.insert(checkerboard.end(), row.begin(), row.end());
  }
  for (uint k = 0; k < 10; ++k) {
    std::vector<GLubyte> row;
    for (uint j = 0; j < 10; ++j) {
      row.insert(row.begin(), {0, 255, 0, 255});
      row.insert(row.end(), {0, 0, 255, 255});
    }
    checkerboard.insert(checkerboard.end(), row.begin(), row.end());
  }
  return checkerboard;
}